

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * fts5ExprPrintTcl(Fts5Config *pConfig,char *zNearsetCmd,Fts5ExprNode *pExpr)

{
  Fts5ExprNearset *pFVar1;
  Fts5ExprPhrase *pFVar2;
  bool bVar3;
  int *piVar4;
  char *pcVar5;
  char *z;
  char *pcStack_68;
  int i_1;
  char *zOp;
  char *zTerm;
  Fts5ExprPhrase *pPhrase;
  int nCol;
  int *aiCol;
  int iTerm;
  int i;
  Fts5ExprNearset *pNear;
  char *zRet;
  Fts5ExprNode *pExpr_local;
  char *zNearsetCmd_local;
  Fts5Config *pConfig_local;
  
  if ((pExpr->eType == 9) || (pExpr->eType == 4)) {
    pFVar1 = pExpr->pNear;
    pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)0x0,"%s ",zNearsetCmd);
    if (pNear == (Fts5ExprNearset *)0x0) {
      return (char *)(Fts5Config *)0x0;
    }
    if (pFVar1->pColset != (Fts5Colset *)0x0) {
      piVar4 = pFVar1->pColset->aiCol;
      if (pFVar1->pColset->nCol == 1) {
        pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear,"-col %d ",(ulong)(uint)*piVar4);
      }
      else {
        pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear,"-col {%d",(ulong)(uint)*piVar4);
        for (aiCol._4_4_ = 1; aiCol._4_4_ < pFVar1->pColset->nCol; aiCol._4_4_ = aiCol._4_4_ + 1) {
          pNear = (Fts5ExprNearset *)
                  fts5PrintfAppend((char *)pNear," %d",(ulong)(uint)piVar4[aiCol._4_4_]);
        }
        pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear,"} ");
      }
      if (pNear == (Fts5ExprNearset *)0x0) {
        return (char *)(Fts5Config *)0x0;
      }
    }
    if ((1 < pFVar1->nPhrase) &&
       (pNear = (Fts5ExprNearset *)
                fts5PrintfAppend((char *)pNear,"-near %d ",(ulong)(uint)pFVar1->nNear),
       pNear == (Fts5ExprNearset *)0x0)) {
      return (char *)(Fts5Config *)0x0;
    }
    pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear,"--");
    if (pNear == (Fts5ExprNearset *)0x0) {
      return (char *)(Fts5Config *)0x0;
    }
    for (aiCol._4_4_ = 0; aiCol._4_4_ < pFVar1->nPhrase; aiCol._4_4_ = aiCol._4_4_ + 1) {
      pFVar2 = pFVar1->apPhrase[aiCol._4_4_];
      pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear," {");
      aiCol._0_4_ = 0;
      while( true ) {
        bVar3 = false;
        if (pNear != (Fts5ExprNearset *)0x0) {
          bVar3 = (int)aiCol < pFVar2->nTerm;
        }
        if (!bVar3) break;
        pcVar5 = " ";
        if ((int)aiCol == 0) {
          pcVar5 = "";
        }
        pNear = (Fts5ExprNearset *)
                fts5PrintfAppend((char *)pNear,"%s%s",pcVar5,pFVar2->aTerm[(int)aiCol].zTerm);
        if (pFVar2->aTerm[(int)aiCol].bPrefix != '\0') {
          pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear,"*");
        }
        aiCol._0_4_ = (int)aiCol + 1;
      }
      if (pNear != (Fts5ExprNearset *)0x0) {
        pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear,"}");
      }
      if (pNear == (Fts5ExprNearset *)0x0) {
        return (char *)(Fts5Config *)0x0;
      }
    }
  }
  else {
    if (pExpr->eType == 2) {
      pcStack_68 = "AND";
    }
    else if (pExpr->eType == 3) {
      pcStack_68 = "NOT";
    }
    else {
      pcStack_68 = "OR";
    }
    pNear = (Fts5ExprNearset *)sqlite3_mprintf("%s",pcStack_68);
    z._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (pNear != (Fts5ExprNearset *)0x0) {
        bVar3 = z._4_4_ < pExpr->nChild;
      }
      if (!bVar3) break;
      pcVar5 = fts5ExprPrintTcl(pConfig,zNearsetCmd,pExpr->apChild[z._4_4_]);
      if (pcVar5 == (char *)0x0) {
        sqlite3_free(pNear);
        pNear = (Fts5ExprNearset *)0x0;
      }
      else {
        pNear = (Fts5ExprNearset *)fts5PrintfAppend((char *)pNear," [%z]",pcVar5);
      }
      z._4_4_ = z._4_4_ + 1;
    }
  }
  return (char *)(Fts5Config *)pNear;
}

Assistant:

static char *fts5ExprPrintTcl(
  Fts5Config *pConfig, 
  const char *zNearsetCmd,
  Fts5ExprNode *pExpr
){
  char *zRet = 0;
  if( pExpr->eType==FTS5_STRING || pExpr->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pExpr->pNear;
    int i; 
    int iTerm;

    zRet = fts5PrintfAppend(zRet, "%s ", zNearsetCmd);
    if( zRet==0 ) return 0;
    if( pNear->pColset ){
      int *aiCol = pNear->pColset->aiCol;
      int nCol = pNear->pColset->nCol;
      if( nCol==1 ){
        zRet = fts5PrintfAppend(zRet, "-col %d ", aiCol[0]);
      }else{
        zRet = fts5PrintfAppend(zRet, "-col {%d", aiCol[0]);
        for(i=1; i<pNear->pColset->nCol; i++){
          zRet = fts5PrintfAppend(zRet, " %d", aiCol[i]);
        }
        zRet = fts5PrintfAppend(zRet, "} ");
      }
      if( zRet==0 ) return 0;
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, "-near %d ", pNear->nNear);
      if( zRet==0 ) return 0;
    }

    zRet = fts5PrintfAppend(zRet, "--");
    if( zRet==0 ) return 0;

    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];

      zRet = fts5PrintfAppend(zRet, " {");
      for(iTerm=0; zRet && iTerm<pPhrase->nTerm; iTerm++){
        char *zTerm = pPhrase->aTerm[iTerm].zTerm;
        zRet = fts5PrintfAppend(zRet, "%s%s", iTerm==0?"":" ", zTerm);
        if( pPhrase->aTerm[iTerm].bPrefix ){
          zRet = fts5PrintfAppend(zRet, "*");
        }
      }

      if( zRet ) zRet = fts5PrintfAppend(zRet, "}");
      if( zRet==0 ) return 0;
    }

  }else{
    char const *zOp = 0;
    int i;
    switch( pExpr->eType ){
      case FTS5_AND: zOp = "AND"; break;
      case FTS5_NOT: zOp = "NOT"; break;
      default: 
        assert( pExpr->eType==FTS5_OR );
        zOp = "OR"; 
        break;
    }

    zRet = sqlite3_mprintf("%s", zOp);
    for(i=0; zRet && i<pExpr->nChild; i++){
      char *z = fts5ExprPrintTcl(pConfig, zNearsetCmd, pExpr->apChild[i]);
      if( !z ){
        sqlite3_free(zRet);
        zRet = 0;
      }else{
        zRet = fts5PrintfAppend(zRet, " [%z]", z);
      }
    }
  }

  return zRet;
}